

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

double __thiscall gmath::PinholeCamera::projectPoint(PinholeCamera *this,Vector2d *p,Vector3d *Pw)

{
  Distortion *pDVar1;
  int i_1;
  long lVar2;
  Matrix33d *pMVar3;
  undefined8 *puVar4;
  int k_1;
  Matrix33d *pMVar5;
  int i;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Vector3d Pc;
  SVector<double,_3> ret;
  undefined1 local_b8 [16];
  double local_a8;
  undefined1 local_98 [16];
  undefined8 local_88;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58 [9];
  
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[8] = 0;
  lVar2 = 0;
  auVar8 = _DAT_00163c10;
  do {
    if (SUB164(auVar8 ^ _DAT_00163c20,4) == DAT_00163c30._4_4_ &&
        SUB164(auVar8 ^ _DAT_00163c20,0) < DAT_00163c30) {
      *(undefined8 *)((long)local_58 + lVar2) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_58 + lVar2 + 0x20) = 0x3ff0000000000000;
    }
    lVar6 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar6 + 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x80);
  pMVar3 = &(this->super_Camera).R;
  puVar4 = local_58;
  lVar2 = 0;
  do {
    lVar6 = 0;
    pMVar5 = pMVar3;
    do {
      puVar4[lVar6] = pMVar5->v[0][0];
      lVar6 = lVar6 + 1;
      pMVar5 = (Matrix33d *)(pMVar5->v + 1);
    } while (lVar6 != 3);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 3;
    pMVar3 = (Matrix33d *)(pMVar3->v[0] + 1);
  } while (lVar2 != 3);
  local_98 = (undefined1  [16])0x0;
  local_88 = 0;
  lVar2 = 0;
  do {
    *(double *)(local_98 + lVar2 * 8) = Pw->v[lVar2] - (this->super_Camera).T.v[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8 = (undefined1  [16])0x0;
  local_a8 = 0.0;
  puVar4 = local_58;
  lVar2 = 0;
  do {
    dVar7 = *(double *)(local_b8 + lVar2 * 8);
    lVar6 = 0;
    do {
      dVar7 = dVar7 + (double)puVar4[lVar6] * *(double *)(local_98 + lVar6 * 8);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    *(double *)(local_b8 + lVar2 * 8) = dVar7;
    local_68 = local_a8;
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 3;
  } while (lVar2 != 3);
  local_78 = this->rho;
  lVar2 = 0;
  do {
    *(double *)(local_b8 + lVar2 * 8) = *(double *)(local_b8 + lVar2 * 8) / local_68;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pDVar1 = this->dist;
  if (pDVar1 != (Distortion *)0x0) {
    uStack_60 = 0;
    uStack_70 = 0;
    (*pDVar1->_vptr_Distortion[6])(local_b8._0_8_,pDVar1,local_b8);
  }
  p->v[0] = (this->A).v[0][0] * (double)local_b8._0_8_ + (this->A).v[0][1] * (double)local_b8._8_8_
            + (this->A).v[0][2];
  p->v[1] = (double)local_b8._8_8_ * (this->A).v[1][1] + (this->A).v[1][2];
  return (double)(~-(ulong)(0.0 < local_68) & 0xbff0000000000000 |
                 (~-(ulong)(local_78 != 0.0) & 0x7ff0000000000000 |
                 (ulong)(local_78 / local_68) & -(ulong)(local_78 != 0.0)) &
                 -(ulong)(0.0 < local_68));
}

Assistant:

double PinholeCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  // transform into camera coordiante system

  Vector3d Pc=transpose(getR())*(Pw-getT());

  // if rho is given, then compute disparity and determine if the point
  // is behind the camera

  double d=std::numeric_limits<double>::infinity();

  if (rho != 0)
  {
    d=rho/Pc[2];
  }

  if (Pc[2] <= 0)
  {
    d=-1;
  }

  // apply lens distortion

  Pc/=Pc[2];

  if (dist != 0)
  {
    const double x=Pc[0];
    const double y=Pc[1];
    dist->transform(Pc[0], Pc[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*Pc[0]+A(0, 1)*Pc[1]+A(0, 2);
  p[1]=A(1, 1)*Pc[1]+A(1, 2);

  return d;
}